

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  char *pcVar1;
  size_t sVar2;
  uint uVar3;
  pointer pIVar4;
  element_type *config;
  undefined1 local_250 [8];
  SectionStats testCaseSectionStats;
  undefined1 local_1c8 [7];
  bool missingAssertions;
  Counts assertions;
  TestFailureException *anon_var_0;
  undefined1 local_180 [6];
  AssertionReaction dummyReaction;
  RedirectedStreams redirectedStreams;
  Timer local_f0;
  Timer timer;
  size_type sStack_e0;
  StringRef local_c8;
  undefined4 local_b8;
  double local_b0;
  double duration;
  Counts prevAssertions;
  undefined1 local_78 [8];
  SectionInfo testCaseSection;
  TestCaseInfo *testCaseInfo;
  string *redirectedCerr_local;
  string *redirectedCout_local;
  RunContext *this_local;
  
  testCaseSection.lineInfo.line = (size_t)TestCase::getTestCaseInfo(this->m_activeTestCase);
  SectionInfo::SectionInfo
            ((SectionInfo *)local_78,&((TestCaseInfo *)testCaseSection.lineInfo.line)->lineInfo,
             (string *)testCaseSection.lineInfo.line);
  pIVar4 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->(&this->m_reporter);
  (*pIVar4->_vptr_IStreamingReporter[8])(pIVar4,(SectionInfo *)local_78);
  prevAssertions.failed = (this->m_totals).assertions.failedButOk;
  duration = (double)(this->m_totals).assertions.passed;
  prevAssertions.passed = (this->m_totals).assertions.failed;
  local_b0 = 0.0;
  this->m_shouldReportUnexpected = true;
  _timer = operator____sr("TEST_CASE",9);
  pcVar1 = *(char **)(testCaseSection.lineInfo.line + 0x90);
  sVar2 = *(size_t *)(testCaseSection.lineInfo.line + 0x98);
  local_c8.m_start = (char *)0x0;
  local_c8.m_size = 0;
  StringRef::StringRef(&local_c8);
  local_b8 = 1;
  (this->m_lastAssertionInfo).resultDisposition = Normal;
  (this->m_lastAssertionInfo).capturedExpression.m_start = local_c8.m_start;
  (this->m_lastAssertionInfo).capturedExpression.m_size = local_c8.m_size;
  (this->m_lastAssertionInfo).lineInfo.file = pcVar1;
  (this->m_lastAssertionInfo).lineInfo.line = sVar2;
  (this->m_lastAssertionInfo).macroName.m_start = (char *)timer.m_nanoseconds;
  (this->m_lastAssertionInfo).macroName.m_size = sStack_e0;
  config = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&this->m_config);
  seedRng(config);
  Timer::Timer(&local_f0);
  pIVar4 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->(&this->m_reporter);
  uVar3 = (*pIVar4->_vptr_IStreamingReporter[2])();
  if ((uVar3 & 1) == 0) {
    Timer::start(&local_f0);
    invokeActiveTestCase(this);
  }
  else {
    RedirectedStreams::RedirectedStreams
              ((RedirectedStreams *)local_180,redirectedCout,redirectedCerr);
    Timer::start(&local_f0);
    invokeActiveTestCase(this);
    RedirectedStreams::~RedirectedStreams((RedirectedStreams *)local_180);
  }
  local_b0 = Timer::getElapsedSeconds(&local_f0);
  Counts::operator-((Counts *)local_1c8,&(this->m_totals).assertions,(Counts *)&duration);
  testCaseSectionStats._127_1_ = testForMissingAssertions(this,(Counts *)local_1c8);
  (*this->m_testCaseTracker->_vptr_ITracker[8])();
  handleUnfinishedSections(this);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear
            (&this->m_messages);
  clara::std::vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>::clear
            (&this->m_messageScopes);
  SectionStats::SectionStats
            ((SectionStats *)local_250,(SectionInfo *)local_78,(Counts *)local_1c8,local_b0,
             (bool)(testCaseSectionStats._127_1_ & 1));
  pIVar4 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->(&this->m_reporter);
  (*pIVar4->_vptr_IStreamingReporter[0xf])(pIVar4,local_250);
  SectionStats::~SectionStats((SectionStats *)local_250);
  SectionInfo::~SectionInfo((SectionInfo *)local_78);
  return;
}

Assistant:

void RunContext::runCurrentTest(std::string & redirectedCout, std::string & redirectedCerr) {
        auto const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
        SectionInfo testCaseSection(testCaseInfo.lineInfo, testCaseInfo.name);
        m_reporter->sectionStarting(testCaseSection);
        Counts prevAssertions = m_totals.assertions;
        double duration = 0;
        m_shouldReportUnexpected = true;
        m_lastAssertionInfo = { "TEST_CASE"_sr, testCaseInfo.lineInfo, StringRef(), ResultDisposition::Normal };

        seedRng(*m_config);

        Timer timer;
        CATCH_TRY {
            if (m_reporter->getPreferences().shouldRedirectStdOut) {
#if !defined(CATCH_CONFIG_EXPERIMENTAL_REDIRECT)
                RedirectedStreams redirectedStreams(redirectedCout, redirectedCerr);

                timer.start();
                invokeActiveTestCase();
#else
                OutputRedirect r(redirectedCout, redirectedCerr);
                timer.start();
                invokeActiveTestCase();
#endif
            }